

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_bpmb_enumerator(FRAME_TYPE frame_type,int is_screen_content_type)

{
  int enumerator;
  int is_screen_content_type_local;
  FRAME_TYPE frame_type_local;
  
  if (is_screen_content_type == 0) {
    enumerator = 1500000;
    if (frame_type == '\0') {
      enumerator = 2000000;
    }
  }
  else {
    enumerator = 750000;
    if (frame_type == '\0') {
      enumerator = 1000000;
    }
  }
  return enumerator;
}

Assistant:

static int get_bpmb_enumerator(FRAME_TYPE frame_type,
                               const int is_screen_content_type) {
  int enumerator;

  if (is_screen_content_type) {
    enumerator = (frame_type == KEY_FRAME) ? 1000000 : 750000;
  } else {
    enumerator = (frame_type == KEY_FRAME) ? 2000000 : 1500000;
  }

  return enumerator;
}